

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmGen9TextureCalc::FillTex2D
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pRestrictions)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint8_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  GMM_PLATFORM_INFO *pGVar30;
  SKU_FEATURE_TABLE *pSVar31;
  int iVar32;
  uint local_ec;
  uint local_e8;
  uint local_e0;
  uint32_t local_dc;
  uint32_t local_d8;
  uint32_t local_cc;
  uint32_t local_c0;
  uint local_b4;
  uint local_ac;
  bool local_a7;
  uint local_a4;
  int local_a0;
  int local_98;
  int local_90;
  undefined4 local_8c;
  uint32_t AlignedWidthLod2;
  uint32_t AlignedWidthLod1;
  uint32_t Alignment;
  bool csRestrictionsMet;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_STATUS Status;
  uint uStack_58;
  uint8_t Compress;
  uint32_t Pitch;
  uint32_t ExpandedArraySize;
  uint32_t BlockHeight;
  uint32_t AlignedWidth;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t DAlign;
  uint32_t VAlign;
  uint32_t HAlign;
  uint32_t BitsPerPixel;
  uint32_t Height;
  uint32_t Width;
  __GMM_BUFFER_TYPE *pRestrictions_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (pRestrictions == (__GMM_BUFFER_TYPE *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    _Height = pRestrictions;
    pRestrictions_local = (__GMM_BUFFER_TYPE *)pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    pGVar30 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
    VAlign = pRestrictions_local->RenderPitchAlignment;
    uVar1._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar1._4_4_ = pRestrictions_local->MinPitch;
    if (((uVar1 >> 1 & 1) != 0) &&
       (uVar2._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar2._4_4_ = pRestrictions_local->MinPitch, (uVar2 >> 0x29 & 1) != 0)) {
      VAlign = 8;
    }
    HAlign = pRestrictions_local->MinHeight;
    BitsPerPixel = (uint32_t)pRestrictions_local->MinAllocationSize;
    if (*(uint *)((long)&pRestrictions_local->MaxHeight + 4) < 2) {
      local_8c = 1;
    }
    else {
      local_8c = *(undefined4 *)((long)&pRestrictions_local->MaxHeight + 4);
    }
    *(undefined4 *)((long)&pRestrictions_local->MaxHeight + 4) = local_8c;
    if (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) != 0) ||
       ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) != 0)) {
      GmmTextureCalc::FindMipTailStartLod
                (&this->super_GmmTextureCalc,(GMM_TEXTURE_INFO *)pRestrictions_local);
    }
    if (*(uint *)((long)&pRestrictions_local->MinWidth + 4) < 2) {
      local_90 = 1;
    }
    else {
      local_90 = *(int *)((long)&pRestrictions_local->MinWidth + 4);
    }
    iVar32 = 1;
    if (pRestrictions_local->Alignment == 4) {
      iVar32 = 6;
    }
    if (pRestrictions_local->Alignment == 3) {
      local_98 = *(int *)&pRestrictions_local->field_0x2c;
    }
    else {
      local_98 = 1;
    }
    uVar3._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar3._4_4_ = pRestrictions_local->MinPitch;
    if (((((uVar3 >> 6 & 1) == 0) &&
         (uVar4._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar4._4_4_ = pRestrictions_local->MinPitch, (uVar4 >> 0x1d & 1) == 0)) &&
        ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) == 0)) &&
       ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) == 0)) {
      local_a0 = *(int *)((long)&pRestrictions_local->MaxHeight + 4);
    }
    else {
      local_a0 = 1;
    }
    local_a4 = local_90 * iVar32 * local_98 * local_a0;
    if (((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) != 0) ||
       (uStack_58 = local_a4, (*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) != 0)) {
      if (pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileDepth != 0) {
        local_a4 = (local_a4 +
                   (pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileDepth - 1))
                   / pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileDepth;
      }
      uStack_58 = local_a4;
    }
    uVar5._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar5._4_4_ = pRestrictions_local->MinPitch;
    if (((uVar5 >> 3 & 1) != 0) ||
       (uVar6._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar6._4_4_ = pRestrictions_local->MinPitch, (uVar6 >> 4 & 1) != 0)) {
      local_a7 = false;
      if ((((uStack_58 < 3) &&
           (local_a7 = false, uStack_58 == *(uint *)((long)&pRestrictions_local->MinWidth + 4))) &&
          ((((pRestrictions_local->PitchAlignment == 0x7e ||
             (pRestrictions_local->PitchAlignment == 0x7f)) ||
            (pRestrictions_local->PitchAlignment == 0x17)) ||
           (((pRestrictions_local->PitchAlignment == 0x18 ||
             (pRestrictions_local->PitchAlignment == 0x19)) ||
            (local_a7 = false, pRestrictions_local->PitchAlignment == 0x1a)))))) &&
         ((uVar7._0_4_ = pRestrictions_local->LockPitchAlignment,
          uVar7._4_4_ = pRestrictions_local->MinPitch, (uVar7 >> 3 & 1) == 0 ||
          (local_a7 = true, (BitsPerPixel & 0xf) != 0)))) {
        uVar8._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar8._4_4_ = pRestrictions_local->MinPitch;
        local_a7 = (uVar8 >> 4 & 1) != 0 && BitsPerPixel % 0xc == 0;
      }
      if (local_a7) {
        uStack_58 = 4;
      }
      else {
        uVar9._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar9._4_4_ = pRestrictions_local->MinPitch;
        pRestrictions_local->LockPitchAlignment = (int)(uVar9 & 0xfffffffffffffff7);
        pRestrictions_local->MinPitch = (int)((uVar9 & 0xfffffffffffffff7) >> 0x20);
        uVar10._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar10._4_4_ = pRestrictions_local->MinPitch;
        pRestrictions_local->LockPitchAlignment = (int)(uVar10 & 0xffffffffffffffef);
        pRestrictions_local->MinPitch = (int)((uVar10 & 0xffffffffffffffef) >> 0x20);
      }
    }
    DAlign = pRestrictions_local->MaxDepth;
    CompressHeight = pRestrictions_local->MaxArraySize;
    CompressWidth = *(uint32_t *)&pRestrictions_local->NeedPow2LockAlignment;
    GmmTextureCalc::GetCompressionBlockDimensions
              (&this->super_GmmTextureCalc,pRestrictions_local->PitchAlignment,&AlignedWidth,
               &CompressDepth,&BlockHeight);
    uVar27 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,
                             pRestrictions_local->PitchAlignment);
    if (uStack_58 < 2) {
      pRestrictions_local[1].LockPitchAlignment = 0;
      Pitch = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[6])(this,pRestrictions_local);
    }
    else {
      AlignedWidthLod2 = CompressHeight;
      if ((((pRestrictions_local->Alignment == 3) &&
           ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x13 & 1) == 0)) ||
          (((uVar11._0_4_ = pRestrictions_local->LockPitchAlignment,
            uVar11._4_4_ = pRestrictions_local->MinPitch, (uVar11 >> 0x19 & 1) != 0 &&
            (pSVar31 = Context::GetSkuTable((this->super_GmmTextureCalc).pGmmLibContext),
            (*(byte *)&pSVar31->field_5 >> 1 & 1) != 0)) ||
           ((*(ushort *)((long)&pRestrictions_local->MaxPitch + 4) >> 0xb & 1) != 0)))) &&
         ((AlignedWidthLod2 =
                pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight,
          uVar12._0_4_ = pRestrictions_local->LockPitchAlignment,
          uVar12._4_4_ = pRestrictions_local->MinPitch, (uVar12 >> 0x1d & 1) != 0 &&
          ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x22 & 1) != 0)))) {
        AlignedWidthLod2 = AlignedWidthLod2 << 1;
      }
      local_ac = Get2DMipMapTotalHeight(this,(GMM_TEXTURE_INFO *)pRestrictions_local);
      if (AlignedWidthLod2 != 0) {
        local_ac = local_ac +
                   ((AlignedWidthLod2 - 1) - (local_ac + (AlignedWidthLod2 - 1)) % AlignedWidthLod2)
        ;
      }
      Pitch = local_ac;
      pRestrictions_local[1].LockPitchAlignment = local_ac;
      if (uVar27 == '\0') {
        uVar13._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar13._4_4_ = pRestrictions_local->MinPitch;
        if (((uVar13 >> 0x1d & 1) == 0) ||
           ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x22 & 1) == 0)) {
          uVar14._0_4_ = pRestrictions_local->LockPitchAlignment;
          uVar14._4_4_ = pRestrictions_local->MinPitch;
          if (((uVar14 >> 1 & 1) != 0) &&
             (uVar15._0_4_ = pRestrictions_local->LockPitchAlignment,
             uVar15._4_4_ = pRestrictions_local->MinPitch, (uVar15 >> 0x29 & 1) != 0)) {
            Pitch = local_ac >> 4;
          }
        }
        else {
          Pitch = local_ac >> 1;
        }
      }
      else {
        if (CompressDepth == 0) {
          local_b4 = local_ac;
        }
        else {
          local_b4 = (local_ac + (CompressDepth - 1)) / CompressDepth;
        }
        Pitch = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0xb])
                          (this,pRestrictions_local,(ulong)local_b4,(ulong)uStack_58);
      }
      Pitch = uStack_58 * Pitch;
    }
    uVar16._0_4_ = pRestrictions_local->LockPitchAlignment;
    uVar16._4_4_ = pRestrictions_local->MinPitch;
    if (((uVar16 >> 6 & 1) == 0) &&
       (uVar17._0_4_ = pRestrictions_local->LockPitchAlignment,
       uVar17._4_4_ = pRestrictions_local->MinPitch, (uVar17 >> 0x1d & 1) == 0)) {
      local_c0 = 1;
    }
    else {
      local_c0 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
    }
    local_dc = GmmTextureCalc::ExpandWidth(&this->super_GmmTextureCalc,BitsPerPixel,DAlign,local_c0)
    ;
    ExpandedArraySize = local_dc;
    if (((((*(ulong *)&pRestrictions_local->field_0x14 >> 0x25 & 1) == 0) &&
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x26 & 1) == 0)) ||
        (1 < *(uint *)&pRestrictions_local->field_0x5c)) &&
       (1 < (uint)pRestrictions_local->MinWidth)) {
      uVar18._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar18._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar18 >> 6 & 1) == 0) &&
         (uVar19._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar19._4_4_ = pRestrictions_local->MinPitch, (uVar19 >> 0x1d & 1) == 0)) {
        local_cc = 1;
      }
      else {
        local_cc = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
      }
      uVar28 = GmmTextureCalc::ExpandWidth
                         (&this->super_GmmTextureCalc,BitsPerPixel >> 1,DAlign,local_cc);
      uVar20._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar20._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar20 >> 6 & 1) == 0) &&
         (uVar21._0_4_ = pRestrictions_local->LockPitchAlignment,
         uVar21._4_4_ = pRestrictions_local->MinPitch, (uVar21 >> 0x1d & 1) == 0)) {
        local_d8 = 1;
      }
      else {
        local_d8 = *(uint32_t *)((long)&pRestrictions_local->MaxHeight + 4);
      }
      uVar29 = GmmTextureCalc::ExpandWidth
                         (&this->super_GmmTextureCalc,BitsPerPixel >> 2,DAlign,local_d8);
      if (local_dc <= uVar28 + uVar29) {
        local_dc = uVar28 + uVar29;
      }
      ExpandedArraySize = local_dc;
    }
    if (uVar27 == '\0') {
      uVar22._0_4_ = pRestrictions_local->LockPitchAlignment;
      uVar22._4_4_ = pRestrictions_local->MinPitch;
      if (((uVar22 >> 0x1d & 1) == 0) ||
         ((*(ulong *)&pRestrictions_local->field_0x14 >> 0x22 & 1) == 0)) {
        uVar23._0_4_ = pRestrictions_local->LockPitchAlignment;
        uVar23._4_4_ = pRestrictions_local->MinPitch;
        if (((uVar23 >> 1 & 1) == 0) ||
           (uVar24._0_4_ = pRestrictions_local->LockPitchAlignment,
           uVar24._4_4_ = pRestrictions_local->MinPitch, (uVar24 >> 0x29 & 1) == 0)) {
          uVar25._0_4_ = pRestrictions_local->LockPitchAlignment;
          uVar25._4_4_ = pRestrictions_local->MinPitch;
          if ((uVar25 >> 3 & 1) == 0) {
            uVar26._0_4_ = pRestrictions_local->LockPitchAlignment;
            uVar26._4_4_ = pRestrictions_local->MinPitch;
            if ((uVar26 >> 4 & 1) != 0) {
              ExpandedArraySize =
                   (*(int *)((long)&pRestrictions_local->MinWidth + 4) * ExpandedArraySize) / 3;
            }
          }
          else {
            ExpandedArraySize =
                 *(int *)((long)&pRestrictions_local->MinWidth + 4) * ExpandedArraySize >> 2;
          }
        }
        else {
          uVar28 = pRestrictions_local->RenderPitchAlignment;
          if (uVar28 == 0x20) {
            ExpandedArraySize = ExpandedArraySize >> 3;
          }
          else if (uVar28 == 0x40) {
            ExpandedArraySize = ExpandedArraySize >> 2;
          }
          else if (uVar28 == 0x80) {
            ExpandedArraySize = ExpandedArraySize >> 1;
          }
        }
      }
      else {
        ExpandedArraySize = ExpandedArraySize << 1;
      }
    }
    else {
      if (AlignedWidth == 0) {
        local_e0 = ExpandedArraySize;
      }
      else {
        local_e0 = (ExpandedArraySize + (AlignedWidth - 1)) / AlignedWidth;
      }
      ExpandedArraySize = local_e0;
    }
    local_e8 = ExpandedArraySize * VAlign >> 3;
    if (local_e8 <= _Height->MinPitch) {
      local_e8 = _Height->MinPitch;
    }
    Status = (local_e8 + (_Height->PitchAlignment - 1)) -
             (local_e8 + (_Height->PitchAlignment - 1) & _Height->PitchAlignment - 1);
    if (pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalSize != 0) {
      Status = (Status + (pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth
                         - 1)) -
               (Status + (pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth
                         - 1) &
               pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileWidth - 1);
      Pitch = (Pitch + (pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight -
                       1)) -
              (Pitch + (pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight -
                       1) &
              pGVar30->TileInfo[(uint)pRestrictions_local[4].MinWidth].LogicalTileHeight - 1);
    }
    *(ulong *)&pRestrictions_local->field_0x14 =
         *(ulong *)&pRestrictions_local->field_0x14 & 0xffffffffffff7fff | 0x8000;
    *(ulong *)&pRestrictions_local->field_0x14 =
         *(ulong *)&pRestrictions_local->field_0x14 & 0xfffffffffffdffff;
    uVar27 = GmmIsYUVPacked(pRestrictions_local->PitchAlignment);
    if (((uVar27 != '\0') || (pRestrictions_local->RenderPitchAlignment == 0x60)) ||
       (pRestrictions_local->RenderPitchAlignment == 0x30)) {
      if (Status == GMM_SUCCESS) {
        local_ec = 0x10;
      }
      else {
        local_ec = (Status + 0xf) / Status;
      }
      Pitch = local_ec + 1 + Pitch;
    }
    this_local._4_4_ =
         GmmTextureCalc::FillTexPitchAndSize
                   (&this->super_GmmTextureCalc,(GMM_TEXTURE_INFO *)pRestrictions_local,
                    (ulong)Status,(Pitch + 1) - (Pitch + 1 & 1),_Height);
    if (this_local._4_4_ == GMM_SUCCESS) {
      (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[7])(this,pRestrictions_local);
    }
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen9TextureCalc::FillTex2D(GMM_TEXTURE_INFO * pTexInfo,
                                                             __GMM_BUFFER_TYPE *pRestrictions)
{
    uint32_t   Width, Height, BitsPerPixel;
    uint32_t   HAlign, VAlign, DAlign, CompressHeight, CompressWidth, CompressDepth;
    uint32_t   AlignedWidth, BlockHeight, ExpandedArraySize, Pitch;
    uint8_t    Compress = 0;
    GMM_STATUS Status;

    GMM_DPF_ENTER;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pRestrictions, GMM_ERROR);

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    BitsPerPixel = pTexInfo->BitsPerPixel;
    if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        // Aux Surfaces are 8bpp.
        BitsPerPixel = 8;
    }

    Height = pTexInfo->BaseHeight;
    Width  = GFX_ULONG_CAST(pTexInfo->BaseWidth);

    pTexInfo->MSAA.NumSamples = GFX_MAX(pTexInfo->MSAA.NumSamples, 1);

    if(pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs)
    {
        FindMipTailStartLod(pTexInfo);
    }

    ExpandedArraySize =
    GFX_MAX(pTexInfo->ArraySize, 1) *
    ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1) *             // Cubemaps simply 6-element, 2D arrays.
    ((pTexInfo->Type == RESOURCE_3D) ? pTexInfo->Depth : 1) * // 3D's simply 2D arrays.
    ((pTexInfo->Flags.Gpu.Depth || pTexInfo->Flags.Gpu.SeparateStencil ||
      (pTexInfo->Flags.Info.TiledYs || pTexInfo->Flags.Info.TiledYf)) ? // MSAA Ys samples are NOT stored as array planes.
     1 :
     pTexInfo->MSAA.NumSamples); // MSAA (non-Depth/Stencil) RT samples stored as array planes.

    if(pTexInfo->Flags.Info.TiledYs || pTexInfo->Flags.Info.TiledYf)
    {
        ExpandedArraySize = GFX_CEIL_DIV(ExpandedArraySize, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileDepth);
    }

    //
    // Check for color separation
    //
    if(pTexInfo->Flags.Gpu.ColorSeparation || pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        bool csRestrictionsMet = (((ExpandedArraySize <= 2) &&
                                   (ExpandedArraySize == pTexInfo->ArraySize) &&
                                   ((pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_R8G8B8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8A8_UNORM_SRGB) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM) ||
                                    (pTexInfo->Format == GMM_FORMAT_B8G8R8X8_UNORM_SRGB)) &&
                                   ((pTexInfo->Flags.Gpu.ColorSeparation && (Width % 16) == 0) ||
                                    (pTexInfo->Flags.Gpu.ColorSeparationRGBX && (Width % 12) == 0))));

        if(csRestrictionsMet)
        {
            ExpandedArraySize = GMM_COLOR_SEPARATION_ARRAY_SIZE;
        }
        else
        {
            pTexInfo->Flags.Gpu.ColorSeparation     = false;
            pTexInfo->Flags.Gpu.ColorSeparationRGBX = false;
        }
    }

    HAlign = pTexInfo->Alignment.HAlign;
    VAlign = pTexInfo->Alignment.VAlign;
    DAlign = pTexInfo->Alignment.DAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    Compress = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    /////////////////////////////////
    // Calculate Block Surface Height
    /////////////////////////////////

    if(ExpandedArraySize > 1)
    {
        uint32_t Alignment = VAlign;
        if((pTexInfo->Type == RESOURCE_3D && !pTexInfo->Flags.Info.Linear) ||
           (pTexInfo->Flags.Gpu.S3dDx && pGmmLibContext->GetSkuTable().FtrDisplayEngineS3d) ||
           (pTexInfo->Flags.Wa.MediaPipeUsage))
        {
            Alignment = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
	    //Gmm uses TileY for Stencil allocations, having half TileW height (TileY width compensates)
            if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
            {
                Alignment *= 2;
            }
	}

        // Calculate the overall Block height...Mip0Height + Max(Mip1Height, Sum of Mip2Height..MipnHeight)
        BlockHeight = Get2DMipMapTotalHeight(pTexInfo);
        BlockHeight = GFX_ALIGN_NP2(BlockHeight, Alignment);

        // GMM internally uses QPitch as the logical distance between slices, but translates
        // as appropriate to service client queries in GmmResGetQPitch.
        pTexInfo->Alignment.QPitch = BlockHeight;

        if(Compress)
        {
            BlockHeight = GFX_CEIL_DIV(BlockHeight, CompressHeight);

            BlockHeight = GetAligned3DBlockHeight(pTexInfo, BlockHeight, ExpandedArraySize);
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
        {
            BlockHeight /= 2;
        }
        else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            BlockHeight /= 16;
        }

        BlockHeight *= ExpandedArraySize;
    }
    else
    {
        pTexInfo->Alignment.QPitch = 0;

        BlockHeight = Get2DMipMapHeight(pTexInfo);
    }

    ///////////////////////////////////
    // Calculate Pitch
    ///////////////////////////////////

    AlignedWidth = __GMM_EXPAND_WIDTH(this, Width, HAlign, pTexInfo);

    // Calculate special pitch case of small dimensions where LOD1 + LOD2 widths
    // are greater than LOD0. e.g. dimensions 4x4 and MinPitch == 1
    if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
       (pTexInfo->Alignment.MipTailStartLod < 2))
    {
        // Do nothing -- all mips are in LOD0/LOD1, which is already width aligned.
    }
    else if(pTexInfo->MaxLod >= 2)
    {
        uint32_t AlignedWidthLod1, AlignedWidthLod2;

        AlignedWidthLod1 = __GMM_EXPAND_WIDTH(this, Width >> 1, HAlign, pTexInfo);
        AlignedWidthLod2 = __GMM_EXPAND_WIDTH(this, Width >> 2, HAlign, pTexInfo);

        AlignedWidth = GFX_MAX(AlignedWidth, AlignedWidthLod1 + AlignedWidthLod2);
    }

    if(Compress)
    {
        AlignedWidth = GFX_CEIL_DIV(AlignedWidth, CompressWidth);
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
    {
        AlignedWidth *= 2;
    }
    else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        switch(pTexInfo->BitsPerPixel)
        {
            case 32:
                AlignedWidth /= 8;
                break;
            case 64:
                AlignedWidth /= 4;
                break;
            case 128:
                AlignedWidth /= 2;
                break;
            default:
                __GMM_ASSERT(0);
        }
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparation)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_WIDTH_DIVISION;
    }
    else if(pTexInfo->Flags.Gpu.ColorSeparationRGBX)
    {
        AlignedWidth *= pTexInfo->ArraySize;
        __GMM_ASSERT(0 == (AlignedWidth % GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION));
        AlignedWidth /= GMM_COLOR_SEPARATION_RGBX_WIDTH_DIVISION;
    }

    // Default pitch
    Pitch = AlignedWidth * BitsPerPixel >> 3;

    // Make sure the pitch satisfy linear min pitch requirment
    Pitch = GFX_MAX(Pitch, pRestrictions->MinPitch);

    // Make sure pitch satisfy alignment restriction
    Pitch = GFX_ALIGN(Pitch, pRestrictions->PitchAlignment);

    ////////////////////
    // Adjust for Tiling
    ////////////////////

    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        Pitch       = GFX_ALIGN(Pitch, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth);
        BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
    }

    GMM_ASSERTDPF(pTexInfo->Flags.Info.LayoutBelow || !pTexInfo->Flags.Info.LayoutRight, "MIPLAYOUT_RIGHT not supported after Gen6!");
    pTexInfo->Flags.Info.LayoutBelow = 1;
    pTexInfo->Flags.Info.LayoutRight = 0;

    // If a texture is YUV packed, 96, or 48 bpp then one row plus 16 bytes of
    // padding needs to be added. Since this will create a none pitch aligned
    // surface the padding is aligned to the next row
    if(GmmIsYUVPacked(pTexInfo->Format) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(96)) ||
       (pTexInfo->BitsPerPixel == GMM_BITS(48)))
    {
        BlockHeight += GMM_SCANLINES(1) + GFX_CEIL_DIV(GMM_BYTES(16), Pitch);
    }

    // Align height to even row to cover for HW over-fetch
    BlockHeight = GFX_ALIGN(BlockHeight, __GMM_EVEN_ROW);

    if((Status = // <-- Note assignment.
        FillTexPitchAndSize(
        pTexInfo, Pitch, BlockHeight, pRestrictions)) == GMM_SUCCESS)
    {
        Fill2DTexOffsetAddress(pTexInfo);
    }

    GMM_DPF_EXIT;

    return (Status);
}